

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sms_Apu.cpp
# Opt level: O0

void __thiscall Sms_Apu::write_data(Sms_Apu *this,blip_time_t time,int data)

{
  long lVar1;
  uint uVar2;
  uint in_EDX;
  long in_RDI;
  int select;
  Sms_Square *sq;
  int index;
  undefined4 local_34;
  blip_time_t in_stack_ffffffffffffffdc;
  Sms_Apu *in_stack_ffffffffffffffe0;
  
  run_until(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  if ((in_EDX & 0x80) != 0) {
    *(uint *)(in_RDI + 0x42c) = in_EDX;
  }
  uVar2 = *(int *)(in_RDI + 0x42c) >> 5 & 3;
  if ((*(uint *)(in_RDI + 0x42c) & 0x10) == 0) {
    if (uVar2 < 3) {
      lVar1 = in_RDI + 0x20 + (long)(int)uVar2 * 0x48;
      if ((in_EDX & 0x80) == 0) {
        *(uint *)(lVar1 + 0x38) = *(uint *)(lVar1 + 0x38) & 0xff | (in_EDX & 0x3f) << 8;
      }
      else {
        *(uint *)(lVar1 + 0x38) = *(uint *)(lVar1 + 0x38) & 0xff00 | (in_EDX & 0xf) << 4;
      }
    }
    else {
      if ((in_EDX & 3) < 3) {
        *(int **)(in_RDI + 0x468) = noise_periods + (int)(in_EDX & 3);
      }
      else {
        *(long *)(in_RDI + 0x468) = in_RDI + 0xe8;
      }
      if ((in_EDX & 4) == 0) {
        local_34 = *(undefined4 *)(in_RDI + 0x6ac);
      }
      else {
        local_34 = *(undefined4 *)(in_RDI + 0x6a8);
      }
      *(undefined4 *)(in_RDI + 0x474) = local_34;
      *(undefined4 *)(in_RDI + 0x470) = 0x8000;
    }
  }
  else {
    *(uint *)(*(long *)(in_RDI + (long)(int)uVar2 * 8) + 0x34) =
         (uint)"@2\'\x1f\x18\x13\x0f\f\t\a\x05\x04\x03\x02\x01"[(int)(in_EDX & 0xf)];
  }
  return;
}

Assistant:

void Sms_Apu::write_data( blip_time_t time, int data )
{
	require( (unsigned) data <= 0xFF );
	
	run_until( time );
	
	if ( data & 0x80 )
		latch = data;
	
	int index = (latch >> 5) & 3;
	if ( latch & 0x10 )
	{
		oscs [index]->volume = volumes [data & 15];
	}
	else if ( index < 3 )
	{
		Sms_Square& sq = squares [index];
		if ( data & 0x80 )
			sq.period = (sq.period & 0xFF00) | (data << 4 & 0x00FF);
		else
			sq.period = (sq.period & 0x00FF) | (data << 8 & 0x3F00);
	}
	else
	{
		int select = data & 3;
		if ( select < 3 )
			noise.period = &noise_periods [select];
		else
			noise.period = &squares [2].period;
		
		noise.feedback = (data & 0x04) ? noise_feedback : looped_feedback;
		noise.shifter = 0x8000;
	}
}